

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

int poptGetNextOpt(poptContext con)

{
  char cVar1;
  char cVar2;
  int iVar3;
  pbm_set *ppVar4;
  poptBits *bitsp;
  poptItem ppVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  __gid_t __gid;
  __uid_t __uid;
  char *pcVar10;
  int *piVar11;
  poptArgv ppcVar12;
  size_t sVar13;
  poptString pcVar14;
  char *pcVar15;
  char **__argv;
  char *__dest;
  size_t sVar16;
  char *__dest_00;
  char *pcVar17;
  poptOption *extraout_RAX;
  poptOption *extraout_RAX_00;
  poptOption *opt;
  uint uVar18;
  uint uVar19;
  poptContext ppVar20;
  char **s;
  poptContext con_00;
  size_t longNameLen;
  char **ppcVar21;
  long lVar22;
  char *__s;
  bool bVar23;
  poptBits ppVar24;
  double dVar25;
  void *cbData;
  poptCallbackType cb;
  poptOption *local_68;
  char *local_50;
  void *local_48;
  poptCallbackType local_40;
  char **local_38;
  
  if (con == (poptContext)0x0) {
    return -1;
  }
  local_68 = (poptOption *)0x0;
LAB_001034df:
  ppcVar21 = (char **)0x0;
  local_40 = (poptCallbackType)0x0;
  local_48 = (void *)0x0;
  ppVar20 = (poptContext)con->os;
  bVar6 = false;
  if (ppVar20->optionStack[0].nextCharArg == (char *)0x0) {
LAB_001034fd:
    uVar8 = ppVar20->optionStack[0].argc;
    uVar19 = ppVar20->optionStack[0].next;
    if ((con < ppVar20) && (uVar19 == uVar8)) goto code_r0x00103517;
    if (uVar19 == uVar8) {
      invokeCallbacksPOST(con,con->options);
      if (con->maincall == (_func_int_int_char_ptr_ptr *)0x0) {
        ppVar5 = con->doExec;
        if (ppVar5 != (poptItem)0x0) {
          ppcVar21 = ppVar5->argv;
          if (ppcVar21 == (char **)0x0) {
            return -10;
          }
          iVar7 = ppVar5->argc;
          if ((long)iVar7 < 1) {
            return -10;
          }
          if ((con->execAbsolute == 0) && (pcVar10 = strchr(*ppcVar21,0x2f), pcVar10 != (char *)0x0)
             ) {
            return -10;
          }
          __argv = (char **)malloc(((long)iVar7 +
                                   (long)con->finalArgvCount + (long)con->numLeftovers) * 8 + 0x30);
          if (__argv == (char **)0x0) {
            return -0x15;
          }
          pcVar10 = *ppcVar21;
          pcVar15 = strchr(pcVar10,0x2f);
          if ((pcVar15 == (char *)0x0) && (pcVar15 = con->execPath, pcVar15 != (char *)0x0)) {
            sVar13 = strlen(pcVar15);
            sVar16 = strlen(pcVar10);
            __dest_00 = (char *)malloc(sVar16 + sVar13 + 2);
            if (__dest_00 == (char *)0x0) {
              iVar7 = -10;
              goto LAB_0010433a;
            }
            pcVar15 = stpcpy(__dest_00,pcVar15);
            pcVar15[0] = '/';
            pcVar15[1] = '\0';
            pcVar15 = pcVar15 + 1;
            pcVar10 = *ppVar5->argv;
          }
          else {
            iVar7 = -10;
            if (pcVar10 == (char *)0x0) goto LAB_0010433a;
            s = (char **)0x2f;
            pcVar15 = strchr(pcVar10,0x2f);
            if (pcVar15 == (char *)0x0) {
              pcVar15 = getenv("PATH");
              if (pcVar15 == (char *)0x0) goto LAB_0010433a;
              sVar13 = strlen(pcVar15);
              con_00 = (poptContext)(sVar13 + 1);
              __dest = (char *)malloc((size_t)con_00);
              if (__dest == (char *)0x0) goto LAB_0010438e;
              strcpy(__dest,pcVar15);
              sVar13 = strlen(__dest);
              sVar16 = strlen(pcVar10);
              __dest_00 = (char *)malloc(sVar13 + sVar16 + 2);
              pcVar15 = __dest;
              iVar9 = -10;
              if (__dest_00 != (char *)0x0) goto LAB_0010423b;
              goto LAB_00104332;
            }
            sVar13 = strlen(pcVar10);
            con_00 = (poptContext)(sVar13 + 1);
            pcVar15 = (char *)malloc((size_t)con_00);
            __dest_00 = pcVar15;
            if (pcVar15 == (char *)0x0) goto LAB_00104389;
          }
          strcpy(pcVar15,pcVar10);
          goto LAB_001040f0;
        }
      }
      else {
        (*con->maincall)(con->finalArgvCount,con->finalArgv);
      }
      return -1;
    }
    s = (char **)(long)(int)uVar19;
    ppVar4 = ppVar20->optionStack[0].argb;
    if ((ppVar4 != (pbm_set *)0x0) && ((ppVar4[(ulong)s >> 5].bits[0] >> (uVar19 & 0x1f) & 1) != 0))
    {
      ppVar20->optionStack[0].next = uVar19 + 1;
LAB_00103678:
      bVar23 = false;
      goto LAB_00103e12;
    }
    ppcVar12 = ppVar20->optionStack[0].argv;
    if (ppcVar12 == (poptArgv)0x0) {
      return -0xb;
    }
    ppVar20->optionStack[0].next = uVar19 + 1;
    pcVar10 = ppcVar12[(long)s];
    if (pcVar10 == (char *)0x0) {
      return -0xb;
    }
    if (((con->restLeftover == 0) && (*pcVar10 == '-')) && (cVar1 = pcVar10[1], cVar1 != '\0')) {
      uVar8 = 0x80000000;
      if ((cVar1 == '-') && (uVar8 = 0, pcVar10[2] == '\0')) {
        con->restLeftover = 1;
        goto LAB_00103678;
      }
      pcVar15 = pcVar10 + 1;
      pcVar10 = pcVar10 + 2;
      if (cVar1 != '-') {
        pcVar10 = pcVar15;
      }
      for (longNameLen = 0; (cVar2 = pcVar10[longNameLen], cVar2 != '\0' && (cVar2 != '='));
          longNameLen = longNameLen + 1) {
      }
      bVar23 = false;
      ppcVar21 = (char **)(pcVar10 + longNameLen + 1);
      if (cVar2 != '=') {
        ppcVar21 = (char **)0x0;
      }
      local_38 = s;
      iVar7 = handleAlias(con,pcVar10,longNameLen,'\0',(char *)ppcVar21);
      if (iVar7 == 0) {
        bVar23 = false;
        iVar7 = handleExec(con,pcVar10,'\0');
        if (iVar7 != 0) goto LAB_00103e12;
        local_68 = findOption(con->options,pcVar10,longNameLen,'\0',&local_40,&local_48,uVar8);
        if (cVar1 == '-' && local_68 == (poptOption *)0x0) {
          return -0xb;
        }
        ppVar20 = (poptContext)con->os;
        if (local_68 != (poptOption *)0x0) {
          if ((ppVar20 != con) || ((local_68->argInfo & 0x20000000) == 0)) goto LAB_0010353d;
          poptStripArg(con,(int)local_38);
          ppVar20 = (poptContext)con->os;
          bVar6 = true;
          goto LAB_00103540;
        }
        ppVar20->optionStack[0].nextCharArg = pcVar15;
        local_68 = (poptOption *)0x0;
        bVar6 = false;
        ppcVar21 = (char **)0x0;
        goto LAB_00103553;
      }
      goto LAB_00103e12;
    }
    if ((con->flags & 4) != 0) {
      con->restLeftover = 1;
    }
    if ((con->flags & 0x10) != 0) {
      sVar13 = strlen(pcVar10);
      con_00 = (poptContext)(sVar13 + 1);
      pcVar15 = (char *)malloc((size_t)con_00);
      if (pcVar15 != (char *)0x0) {
        strcpy(pcVar15,pcVar10);
        ppVar20->optionStack[0].nextArg = pcVar15;
        return 0;
      }
      goto LAB_00104384;
    }
    ppcVar12 = con->leftovers;
    bVar23 = false;
    if (ppcVar12 == (poptArgv)0x0) goto LAB_00103e12;
    iVar7 = con->allocLeftovers;
    if (iVar7 <= con->numLeftovers + 1) {
      con->allocLeftovers = iVar7 + 10;
      ppcVar12 = (poptArgv)realloc(ppcVar12,(long)iVar7 * 8 + 0x50);
      con->leftovers = ppcVar12;
    }
    sVar13 = strlen(pcVar10);
    pcVar15 = (char *)malloc(sVar13 + 1);
    if (pcVar15 == (char *)0x0) {
      poptGetNextOpt_cold_2();
      goto LAB_00104358;
    }
    strcpy(pcVar15,pcVar10);
    iVar7 = con->numLeftovers;
    con->numLeftovers = iVar7 + 1;
    bVar23 = false;
    goto LAB_00103e0e;
  }
  goto LAB_00103540;
code_r0x00103517:
  con->os = (optionStackEntry *)&ppVar20[-1].finalArgv;
  cleanOSE(ppVar20->optionStack);
  ppVar20 = (poptContext)con->os;
  if (ppVar20->optionStack[0].nextCharArg != (char *)0x0) goto code_r0x0010353a;
  goto LAB_001034fd;
code_r0x0010353a:
  ppcVar21 = (char **)0x0;
LAB_0010353d:
  bVar6 = false;
LAB_00103540:
  pcVar15 = ppVar20->optionStack[0].nextCharArg;
  if (pcVar15 == (char *)0x0) {
    iVar7 = 0;
    s = ppcVar21;
    if (local_68 == (poptOption *)0x0) {
      return -0xb;
    }
  }
  else {
LAB_00103553:
    ppVar20->optionStack[0].nextCharArg = (char *)0x0;
    pcVar10 = pcVar15 + 1;
    bVar23 = false;
    iVar7 = handleAlias(con,(char *)0x0,0,*pcVar15,pcVar10);
    if (iVar7 != 0) goto LAB_00103e12;
    iVar7 = handleExec(con,(char *)0x0,*pcVar15);
    if (iVar7 != 0) {
      if (*pcVar10 != '\0') {
        con->os->nextCharArg = pcVar10;
      }
      goto LAB_00103e12;
    }
    local_68 = findOption(con->options,(char *)0x0,0,*pcVar15,&local_40,&local_48,0);
    if (local_68 == (poptOption *)0x0) {
      return -0xb;
    }
    iVar7 = 1;
    s = ppcVar21;
    if (*pcVar10 != '\0') {
      con->os->nextCharArg = pcVar10;
    }
  }
  uVar8 = _poptArgMask & local_68->argInfo;
  if ((uVar8 == 7) || (uVar8 == 0)) {
    if (s != (char **)0x0) {
      return -0xc;
    }
    pcVar10 = ((poptContext)con->os)->optionStack[0].nextCharArg;
    if ((pcVar10 != (char *)0x0) && (*pcVar10 == '=')) {
      return -0xc;
    }
    piVar11 = (int *)local_68->arg;
    if (piVar11 != (int *)0x0) {
      lVar22 = 1;
      if (uVar8 == 7) {
        lVar22 = (long)local_68->val;
      }
      uVar8 = poptArgInfo((poptContext)con->os,local_68);
      iVar9 = poptSaveInt(piVar11,uVar8,lVar22);
      if (iVar9 != 0) {
        return -0x13;
      }
    }
    goto LAB_00103c88;
  }
  ppVar20 = (poptContext)con->os;
  pcVar10 = ppVar20->optionStack[0].nextArg;
  if (pcVar10 != (char *)0x0) {
    free(pcVar10);
    ppVar20 = (poptContext)con->os;
  }
  ppVar20->optionStack[0].nextArg = (char *)0x0;
  if (s == (char **)0x0) {
    pcVar10 = ppVar20->optionStack[0].nextCharArg;
    if (pcVar10 == (char *)0x0) {
      uVar8 = ppVar20->optionStack[0].next;
      s = (char **)(ulong)uVar8;
      bVar23 = uVar8 == ppVar20->optionStack[0].argc;
      if (con < ppVar20 && bVar23) {
        do {
          con->os = (optionStackEntry *)&ppVar20[-1].finalArgv;
          cleanOSE(ppVar20->optionStack);
          ppVar20 = (poptContext)con->os;
          uVar8 = ppVar20->optionStack[0].argc;
          uVar19 = ppVar20->optionStack[0].next;
          s = (char **)(ulong)uVar19;
          bVar23 = uVar19 == uVar8;
          if (ppVar20 <= con) break;
        } while (uVar19 == uVar8);
      }
      if (bVar23) {
        if ((local_68->argInfo & 0x10000000) == 0) {
          return -10;
        }
LAB_00103995:
        ppVar20->optionStack[0].nextArg = (char *)0x0;
      }
      else {
        if ((ppVar20 == con) && (bVar6 && (local_68->argInfo & 0x20000000) != 0)) {
          poptStripArg(con,(int)s);
          ppVar20 = (poptContext)con->os;
        }
        ppcVar12 = ppVar20->optionStack[0].argv;
        if (ppcVar12 != (poptArgv)0x0) {
          iVar9 = ppVar20->optionStack[0].next;
          s = (char **)ppcVar12[iVar9];
          if (((local_68->argInfo & 0x10000000) != 0) && (*(char *)s == '-')) goto LAB_00103995;
          ppVar20->optionStack[0].next = iVar9 + 1;
          pcVar10 = expandNextArg(con,(char *)s);
          ppVar20 = (poptContext)con->os;
          ppVar20->optionStack[0].nextArg = pcVar10;
        }
      }
    }
    else {
      s = (char **)(pcVar10 + (*pcVar10 == '='));
      pcVar10 = expandNextArg(con,(char *)s);
      ppVar20 = (poptContext)con->os;
      ppVar20->optionStack[0].nextArg = pcVar10;
      ppVar20->optionStack[0].nextCharArg = (char *)0x0;
    }
  }
  else {
    pcVar10 = expandNextArg(con,(char *)s);
    ppVar20 = (poptContext)con->os;
    ppVar20->optionStack[0].nextArg = pcVar10;
  }
  uVar8 = _poptArgMask;
  bitsp = (poptBits *)local_68->arg;
  if (bitsp == (poptBits *)0x0) goto LAB_00103c88;
  uVar19 = local_68->argInfo;
  uVar18 = _poptArgMask & uVar19;
  switch(uVar18) {
  case 1:
    pcVar10 = ppVar20->optionStack[0].nextArg;
    if (pcVar10 == (char *)0x0) {
      ppVar24 = (poptBits)0x0;
    }
    else {
      sVar13 = strlen(pcVar10);
      con_00 = (poptContext)(sVar13 + 1);
      ppVar24 = (poptBits)malloc((size_t)con_00);
      if (ppVar24 == (poptBits)0x0) {
        poptGetNextOpt_cold_6();
LAB_00104384:
        poptGetNextOpt_cold_1();
LAB_00104389:
        poptGetNextOpt_cold_3();
LAB_0010438e:
        poptGetNextOpt_cold_5();
        goto LAB_00104393;
      }
      strcpy((char *)ppVar24,pcVar10);
    }
    *bitsp = ppVar24;
    goto LAB_00103c88;
  case 2:
  case 3:
  case 10:
  case 0xd:
    uVar18 = poptArgInfo(ppVar20,local_68);
    pcVar10 = ppVar20->optionStack[0].nextArg;
    if (pcVar10 == (char *)0x0) {
      lVar22 = 0;
    }
    else {
      local_50 = (char *)0x0;
      lVar22 = strtoll(pcVar10,&local_50,0);
      if ((local_50 == (char *)0x0) || (*local_50 != '\0')) {
        return -0x11;
      }
      uVar19 = local_68->argInfo;
      uVar8 = _poptArgMask;
    }
    uVar8 = uVar8 & uVar19;
    if ((int)uVar8 < 10) {
      if (uVar8 == 2) {
        if ((int)lVar22 != lVar22) {
          return -0x12;
        }
        iVar9 = poptSaveInt((int *)bitsp,uVar18,lVar22);
      }
      else {
        if (uVar8 != 3) goto LAB_00103c88;
        iVar9 = poptSaveLong((long *)bitsp,uVar18,lVar22);
      }
    }
    else if (uVar8 == 0xd) {
      if ((short)lVar22 != lVar22) {
        return -0x12;
      }
      iVar9 = poptSaveShort((short *)bitsp,uVar18,lVar22);
    }
    else {
      if (uVar8 != 10) goto LAB_00103c88;
      if (lVar22 + 0x8000000000000001U < 2) {
        return -0x12;
      }
      iVar9 = poptSaveLongLong((longlong *)bitsp,uVar18,lVar22);
    }
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xb:
    goto switchD_001038cb_caseD_4;
  case 8:
  case 9:
    local_50 = (char *)0x0;
    pcVar10 = ppVar20->optionStack[0].nextArg;
    if (pcVar10 == (char *)0x0) {
      ppVar24 = (poptBits)0x0;
LAB_00103e24:
      iVar9 = 0;
      if ((_poptArgMask & uVar19) == 8) {
        dVar25 = (double)(~-(ulong)((double)ppVar24 < 2.220446049250313e-16) & (ulong)ppVar24 |
                         ((ulong)ppVar24 ^ 0x8000000000000000) &
                         -(ulong)((double)ppVar24 < 2.220446049250313e-16));
        iVar9 = -0x12;
        if ((1.1754943508222875e-38 - dVar25 <= 2.220446049250313e-16) &&
           (dVar25 + -3.4028234663852886e+38 <= 2.220446049250313e-16)) {
          *(float *)bitsp = (float)(double)ppVar24;
          goto LAB_00103ea1;
        }
      }
      else if ((_poptArgMask & uVar19) == 9) {
        *bitsp = ppVar24;
LAB_00103ea1:
        iVar9 = 0;
      }
    }
    else {
      piVar11 = __errno_location();
      iVar3 = *piVar11;
      *piVar11 = 0;
      ppVar24 = (poptBits)strtod(pcVar10,&local_50);
      iVar9 = -0x12;
      if (*piVar11 != 0x22) {
        *piVar11 = iVar3;
        iVar9 = -0x11;
        if (*local_50 == '\0') {
          uVar19 = local_68->argInfo;
          goto LAB_00103e24;
        }
      }
    }
    break;
  case 0xc:
    iVar9 = poptSaveString((char ***)bitsp,(uint)s,ppVar20->optionStack[0].nextArg);
    break;
  default:
    if (uVar18 != 0x1b) {
      if (uVar18 != 0x1e) goto switchD_001038cb_caseD_4;
      iVar9 = poptSaveBits(bitsp,(uint)s,ppVar20->optionStack[0].nextArg);
      break;
    }
    con->maincall = (_func_int_int_char_ptr_ptr *)bitsp;
    goto LAB_00103c88;
  }
  if (iVar9 != 0) {
    return iVar9;
  }
LAB_00103c88:
  if (local_40 == (poptCallbackType)0x0) {
    if (local_68->val == 0) goto LAB_00103caf;
    bVar23 = (_poptArgMask & local_68->argInfo) != 7;
  }
  else {
    invokeCallbacksOPTION(con,con->options,local_68,local_48,iVar7);
LAB_00103caf:
    bVar23 = false;
  }
  iVar7 = con->finalArgvAlloced;
  ppcVar12 = con->finalArgv;
  if (iVar7 <= con->finalArgvCount + 2) {
    con->finalArgvAlloced = iVar7 + 10;
    ppcVar12 = (poptArgv)realloc(ppcVar12,(long)iVar7 * 8 + 0x50);
    con->finalArgv = ppcVar12;
  }
  if (ppcVar12 != (poptArgv)0x0) {
    if (local_68->longName == (char *)0x0) {
      sVar13 = 3;
    }
    else {
      sVar13 = strlen(local_68->longName);
      sVar13 = sVar13 + 3;
    }
    pcVar14 = (poptString)malloc(sVar13);
    iVar7 = con->finalArgvCount;
    con->finalArgvCount = iVar7 + 1;
    if (pcVar14 == (poptString)0x0) {
      ppcVar12[iVar7] = (poptString)0x0;
    }
    else {
      ppcVar12[iVar7] = pcVar14;
      *pcVar14 = '-';
      pcVar10 = local_68->longName;
      if (pcVar10 == (char *)0x0) {
        pcVar14[1] = local_68->shortName;
        pcVar14[2] = '\0';
      }
      else {
        if ((int)local_68->argInfo < 0) {
          pcVar15 = pcVar14 + 1;
        }
        else {
          pcVar14[1] = '-';
          pcVar15 = pcVar14 + 2;
          pcVar10 = local_68->longName;
        }
        strcpy(pcVar15,pcVar10);
      }
    }
  }
  uVar8 = _poptArgMask & local_68->argInfo;
  if (((local_68->arg == (void *)0x0 || uVar8 != 0) && (uVar8 != 0)) &&
     ((uVar8 != 7 &&
      ((ppcVar12 = con->finalArgv, ppcVar12 != (poptArgv)0x0 &&
       (pcVar10 = con->os->nextArg, pcVar10 != (char *)0x0)))))) {
    sVar13 = strlen(pcVar10);
    pcVar15 = (char *)malloc(sVar13 + 1);
    if (pcVar15 == (char *)0x0) {
LAB_00104358:
      poptGetNextOpt_cold_7();
switchD_001038cb_caseD_4:
      fprintf(_stdout,"option type (%u) not implemented in popt\n");
      exit(1);
    }
    strcpy(pcVar15,pcVar10);
    iVar7 = con->finalArgvCount;
    con->finalArgvCount = iVar7 + 1;
LAB_00103e0e:
    ppcVar12[iVar7] = pcVar15;
  }
LAB_00103e12:
  if (bVar23) {
    if (local_68 != (poptOption *)0x0) {
      return local_68->val;
    }
    return -1;
  }
  goto LAB_001034df;
  while( true ) {
    pcVar17 = strchr(__s,0x3a);
    if (pcVar17 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar15 = pcVar17 + 1;
      *pcVar17 = '\0';
    }
    pcVar17 = stpcpy(__dest_00,__s);
    pcVar17[0] = '/';
    pcVar17[1] = '\0';
    strcpy(pcVar17 + 1,pcVar10);
    iVar7 = access(__dest_00,1);
    if (iVar7 == 0) break;
LAB_0010423b:
    __s = pcVar15;
    if ((__s == (char *)0x0) || (*__s == '\0')) goto LAB_00104320;
  }
  if (*__s == '\0') {
LAB_00104320:
    free(__dest_00);
  }
  else {
    free(__dest);
LAB_001040f0:
    *__argv = __dest_00;
    uVar8 = ppVar5->argc;
    uVar19 = 1;
    if (1 < (int)uVar8) {
      memcpy(__argv + 1,ppVar5->argv + 1,(ulong)(uVar8 - 1) << 3);
      uVar19 = uVar8;
    }
    if (con->finalArgv != (poptArgv)0x0) {
      iVar7 = con->finalArgvCount;
      if (0 < (long)iVar7) {
        memcpy(__argv + uVar19,con->finalArgv,(long)iVar7 << 3);
        uVar19 = uVar19 + iVar7;
      }
    }
    if (con->leftovers != (poptArgv)0x0) {
      iVar7 = con->numLeftovers;
      if (0 < (long)iVar7) {
        memcpy(__argv + uVar19,con->leftovers,(long)iVar7 << 3);
        uVar19 = uVar19 + iVar7;
      }
    }
    __argv[uVar19] = (char *)0x0;
    __gid = getgid();
    iVar7 = setgid(__gid);
    if (iVar7 == 0) {
      __uid = getuid();
      iVar7 = setuid(__uid);
      __dest = *__argv;
      if (iVar7 == 0) {
        s = __argv;
        execvp(__dest,__argv);
        __dest = *__argv;
        sVar13 = strlen(__dest);
        con_00 = (poptContext)(sVar13 + 1);
        pcVar10 = (char *)malloc((size_t)con_00);
        if (pcVar10 == (char *)0x0) {
LAB_00104393:
          poptGetNextOpt_cold_4();
          iVar7 = (int)extraout_RAX;
          opt = extraout_RAX;
          if (s != (char **)0x0) {
            for (; ((iVar7 = (int)opt, *s != (char *)0x0 || (*(char *)(s + 1) != '\0')) ||
                   (s[2] != (char *)0x0)); s = s + 6) {
              opt = (poptOption *)s[2];
              if (opt != (poptOption *)0x0) {
                uVar8 = _poptArgMask & *(uint *)((long)s + 0xc);
                if (uVar8 == 5) {
                  if ((*(uint *)((long)s + 0xc) >> 0x1e & 1) != 0) {
                    opt = (poptOption *)(*(code *)opt)(con_00,1,0,0,s[4]);
                  }
                }
                else if (uVar8 == 4) {
                  if (opt == poptHelpOptions) {
                    opt = poptHelpOptionsI18N;
                  }
                  invokeCallbacksPOST(con_00,opt);
                  opt = extraout_RAX_00;
                }
              }
            }
          }
          return iVar7;
        }
        strcpy(pcVar10,__dest);
        con->execFail = pcVar10;
      }
    }
    else {
      __dest = *__argv;
    }
    iVar7 = -0x10;
    iVar9 = -0x10;
    if (__dest == (char *)0x0) goto LAB_0010433a;
  }
LAB_00104332:
  iVar7 = iVar9;
  free(__dest);
LAB_0010433a:
  free(__argv);
  return iVar7;
}

Assistant:

int poptGetNextOpt(poptContext con)
{
    const struct poptOption * opt = NULL;
    int done = 0;

    if (con == NULL)
	return -1;
    while (!done) {
	const char * origOptString = NULL;
	poptCallbackType cb = NULL;
	const void * cbData = NULL;
	const char * longArg = NULL;
	int canstrip = 0;
	int shorty = 0;

	while (!con->os->nextCharArg && con->os->next == con->os->argc
		&& con->os > con->optionStack) {
	    cleanOSE(con->os--);
	}
	if (!con->os->nextCharArg && con->os->next == con->os->argc) {
	    invokeCallbacksPOST(con, con->options);

	    if (con->maincall) {
		(void) (*con->maincall) (con->finalArgvCount, con->finalArgv);
		return -1;
	    }

	    if (con->doExec) return execCommand(con);
	    return -1;
	}

	/* Process next long option */
	if (!con->os->nextCharArg) {
	    const char * optString;
            size_t optStringLen;
	    int thisopt;

	    if (con->os->argb && PBM_ISSET(con->os->next, con->os->argb)) {
		con->os->next++;
		continue;
	    }
	    thisopt = con->os->next;
	    if (con->os->argv != NULL)	/* XXX can't happen */
	    origOptString = con->os->argv[con->os->next++];

	    if (origOptString == NULL)	/* XXX can't happen */
		return POPT_ERROR_BADOPT;

	    if (con->restLeftover || *origOptString != '-' ||
		(*origOptString == '-' && origOptString[1] == '\0'))
	    {
		if (con->flags & POPT_CONTEXT_POSIXMEHARDER)
		    con->restLeftover = 1;
		if (con->flags & POPT_CONTEXT_ARG_OPTS) {
		    con->os->nextArg = xstrdup(origOptString);
		    return 0;
		}
		if (con->leftovers != NULL) {	/* XXX can't happen */
		    /* One might think we can never overflow the leftovers
		       array.  Actually, that's true, as long as you don't
		       use poptStuffArgs()... */
		    if ((con->numLeftovers + 1) >= (con->allocLeftovers)) {
			con->allocLeftovers += 10;
			con->leftovers =
			    realloc(con->leftovers,
				    sizeof(*con->leftovers) * con->allocLeftovers);
		    }
		    con->leftovers[con->numLeftovers++]
			= xstrdup(origOptString); /* so a free of a stuffed
						     argv doesn't give us a
						     dangling pointer */
		}
		continue;
	    }

	    /* Make a copy we can hack at */
	    optString = origOptString;

	    if (optString[0] == '\0')
		return POPT_ERROR_BADOPT;

	    if (optString[1] == '-' && !optString[2]) {
		con->restLeftover = 1;
		continue;
	    } else {
		const char *oe;
		unsigned int argInfo = 0;

		optString++;
		if (*optString == '-')
		    optString++;
		else
		    argInfo |= POPT_ARGFLAG_ONEDASH;

		/* Check for "--long=arg" option. */
		for (oe = optString; *oe && *oe != '='; oe++)
		    {};
		optStringLen = (size_t)(oe - optString);
		if (*oe == '=')
		    longArg = oe + 1;

		/* XXX aliases with arg substitution need "--alias=arg" */
		if (handleAlias(con, optString, optStringLen, '\0', longArg)) {
		    longArg = NULL;
		    continue;
		}

		if (handleExec(con, optString, '\0'))
		    continue;

		opt = findOption(con->options, optString, optStringLen, '\0', &cb, &cbData,
				 argInfo);
		if (!opt && !LF_ISSET(ONEDASH))
		    return POPT_ERROR_BADOPT;
	    }

	    if (!opt) {
		con->os->nextCharArg = origOptString + 1;
		longArg = NULL;
	    } else {
		if (con->os == con->optionStack && F_ISSET(opt, STRIP))
		{
		    canstrip = 1;
		    poptStripArg(con, thisopt);
		}
		shorty = 0;
	    }
	}

	/* Process next short option */
	if (con->os->nextCharArg) {
	    const char * nextCharArg = con->os->nextCharArg;

	    con->os->nextCharArg = NULL;

	    if (handleAlias(con, NULL, 0, *nextCharArg, nextCharArg + 1))
		continue;

	    if (handleExec(con, NULL, *nextCharArg)) {
		/* Restore rest of short options for further processing */
		nextCharArg++;
		if (*nextCharArg != '\0')
		    con->os->nextCharArg = nextCharArg;
		continue;
	    }

	    opt = findOption(con->options, NULL, 0, *nextCharArg, &cb,
			     &cbData, 0);
	    if (!opt)
		return POPT_ERROR_BADOPT;
	    shorty = 1;

	    nextCharArg++;
	    if (*nextCharArg != '\0')
		con->os->nextCharArg = nextCharArg;
	}

	if (opt == NULL) return POPT_ERROR_BADOPT;	/* XXX can't happen */
	if (poptArgType(opt) == POPT_ARG_NONE || poptArgType(opt) == POPT_ARG_VAL) {
	    if (longArg || (con->os->nextCharArg && con->os->nextCharArg[0] == '='))
		return POPT_ERROR_UNWANTEDARG;
	    if (opt->arg) {
		long val = poptArgType(opt) == POPT_ARG_VAL ? opt->val : 1;
		unsigned int argInfo = poptArgInfo(con, opt);
		if (poptSaveInt((int *)opt->arg, argInfo, val))
		    return POPT_ERROR_BADOPERATION;
	    }
	} else {
	    int rc;

	    con->os->nextArg = _free(con->os->nextArg);
	    if (longArg) {
		longArg = expandNextArg(con, longArg);
		con->os->nextArg = (char *) longArg;
	    } else if (con->os->nextCharArg) {
		longArg = expandNextArg(con, con->os->nextCharArg + (int)(*con->os->nextCharArg == '='));
		con->os->nextArg = (char *) longArg;
		con->os->nextCharArg = NULL;
	    } else {
		while (con->os->next == con->os->argc &&
			con->os > con->optionStack)
		{
		    cleanOSE(con->os--);
		}
		if (con->os->next == con->os->argc) {
		    if (!F_ISSET(opt, OPTIONAL))
			return POPT_ERROR_NOARG;
		    con->os->nextArg = NULL;
		} else {

		    /*
		     * Make sure this isn't part of a short arg or the
		     * result of an alias expansion.
		     */
		    if (con->os == con->optionStack
		     && F_ISSET(opt, STRIP) && canstrip)
		    {
			poptStripArg(con, con->os->next);
		    }
		
		    if (con->os->argv != NULL) {	/* XXX can't happen */
			if (F_ISSET(opt, OPTIONAL) &&
			    con->os->argv[con->os->next][0] == '-') {
			    con->os->nextArg = NULL;
			} else {
			    /* XXX watchout: subtle side-effects live here. */
			    longArg = con->os->argv[con->os->next++];
			    longArg = expandNextArg(con, longArg);
			    con->os->nextArg = (char *) longArg;
			}
		    }
		}
	    }
	    longArg = NULL;

	   /* Save the option argument through a (*opt->arg) pointer. */
	    if (opt->arg != NULL && (rc = poptSaveArg(con, opt)) != 0)
		return rc;
	}

	if (cb)
	    invokeCallbacksOPTION(con, con->options, opt, cbData, shorty);
	else if (opt->val && (poptArgType(opt) != POPT_ARG_VAL))
	    done = 1;

	if ((con->finalArgvCount + 2) >= (con->finalArgvAlloced)) {
	    con->finalArgvAlloced += 10;
	    con->finalArgv = realloc(con->finalArgv,
			    sizeof(*con->finalArgv) * con->finalArgvAlloced);
	}

	if (con->finalArgv != NULL)
	{   char *s = malloc((opt->longName ? strlen(opt->longName) : 0) + sizeof("--"));
	    if (s != NULL) {	/* XXX can't happen */
		con->finalArgv[con->finalArgvCount++] = s;
		*s++ = '-';
		if (opt->longName) {
		    if (!F_ISSET(opt, ONEDASH))
			*s++ = '-';
		    s = stpcpy(s, opt->longName);
		} else {
		    *s++ = opt->shortName;
		    *s = '\0';
		}
	    } else
		con->finalArgv[con->finalArgvCount++] = NULL;
	}

	if (opt->arg && poptArgType(opt) == POPT_ARG_NONE)
	    ;
	else if (poptArgType(opt) == POPT_ARG_VAL)
	    ;
	else if (poptArgType(opt) != POPT_ARG_NONE) {
	    if (con->finalArgv != NULL && con->os->nextArg != NULL)
	        con->finalArgv[con->finalArgvCount++] =
			xstrdup(con->os->nextArg);
	}
    }

    return (opt ? opt->val : -1);	/* XXX can't happen */
}